

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O2

void __thiscall
kj::(anonymous_namespace)::AppendableFileImpl::~AppendableFileImpl(AppendableFileImpl *this)

{
  anon_unknown_35::AppendableFileImpl::~AppendableFileImpl((AppendableFileImpl *)(this + -8));
  return;
}

Assistant:

AppendableFileImpl(Own<const File>&& fileParam): file(kj::mv(fileParam)) {}